

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dependency_list.cpp
# Opt level: O0

uint64_t __thiscall
duckdb::LogicalDependencyHashFunction::operator()
          (LogicalDependencyHashFunction *this,LogicalDependency *a)

{
  char *str;
  hash_t hVar1;
  hash_t hVar2;
  hash_t hash;
  string *catalog;
  CatalogType *type;
  string *schema;
  string *name;
  char *in_stack_ffffffffffffffb0;
  
  ::std::__cxx11::string::c_str();
  str = (char *)Hash<const_char_*>(in_stack_ffffffffffffffb0);
  ::std::__cxx11::string::c_str();
  hVar1 = Hash<const_char_*>(str);
  hVar1 = CombineHash((hash_t)str,hVar1);
  ::std::__cxx11::string::c_str();
  hVar2 = Hash<const_char_*>(str);
  hVar1 = CombineHash(hVar1,hVar2);
  hVar2 = Hash<unsigned_char>('\0');
  hVar1 = CombineHash(hVar1,hVar2);
  return hVar1;
}

Assistant:

uint64_t LogicalDependencyHashFunction::operator()(const LogicalDependency &a) const {
	auto &name = a.entry.name;
	auto &schema = a.entry.schema;
	auto &type = a.entry.type;
	auto &catalog = a.catalog;

	hash_t hash = duckdb::Hash(name.c_str());
	hash = CombineHash(hash, duckdb::Hash(schema.c_str()));
	hash = CombineHash(hash, duckdb::Hash(catalog.c_str()));
	hash = CombineHash(hash, duckdb::Hash<uint8_t>(static_cast<uint8_t>(type)));
	return hash;
}